

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Statements.cpp
# Opt level: O1

TypeDescriptor * __thiscall
CallStatement::evaluateCallExpr
          (CallStatement *this,SymTab *symTab,
          vector<Statement_*,_std::allocator<Statement_*>_> *stack,string *id)

{
  TypeDescriptor *extraout_RAX;
  undefined8 *puVar1;
  
  puVar1 = &std::cout;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"HERE",4);
  *(undefined4 *)(puVar1 + 1) = 0;
  *(undefined1 *)((long)puVar1 + 0xc) = 0;
  puVar1[2] = 0;
  puVar1[3] = 0;
  puVar1[4] = 0;
  puVar1[5] = puVar1 + 7;
  puVar1[6] = 0;
  *(undefined1 *)(puVar1 + 7) = 0;
  puVar1[9] = puVar1 + 0xb;
  puVar1[10] = 0;
  *(undefined1 *)(puVar1 + 0xb) = 0;
  puVar1[0xd] = 0;
  puVar1[0xe] = 0;
  puVar1[0xf] = 0;
  puVar1[0x10] = 0;
  puVar1[0x11] = 0;
  puVar1[0x12] = 0;
  puVar1[0x13] = 0;
  *puVar1 = &PTR_print_0011db88;
  puVar1[0x14] = puVar1 + 0x16;
  std::__cxx11::string::_M_construct<char_const*>((string *)(puVar1 + 0x14),"");
  puVar1[0x1c] = 0;
  puVar1[0x1d] = 0;
  puVar1[0x1a] = 0;
  puVar1[0x1b] = 0;
  puVar1[0x18] = 0;
  puVar1[0x19] = 0;
  return extraout_RAX;
}

Assistant:

TypeDescriptor *CallStatement::evaluateCallExpr(SymTab &symTab,std::vector<Statement*>stack,std::string id) {
//    Functions().setStack();
    //or(int i = 0; i < )
    std::cout << "HERE";
    //std::vector<Statement*>stack = this->_functionStack;
    for(int i = 0; i < stack.size();i++){
        //stack[i]->id();
    }
//    if(findFunction(this)){
//        Function *function = returnFunction(this);
//        SymTab symTab1;
//        for(int i = 0; i < function->paramenters().size(); i++){
//            //symTab1.setValueFor(function->pa)
//        }
//        function->evaluate(symTab1);
//    }
    //return nullptr;
}